

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameterio.cpp
# Opt level: O1

void anon_unknown.dwarf_9fa9::WriteOneParameter(FILE *fp,char *text,double parameter,int size)

{
  size_t __size;
  double *__ptr;
  int parameter_int;
  double local_20;
  int local_14;
  
  local_20 = parameter;
  fwrite(text,1,4,(FILE *)fp);
  if (size == 4) {
    local_14 = (int)parameter;
    __ptr = (double *)&local_14;
    __size = 4;
  }
  else {
    __ptr = &local_20;
    __size = 8;
  }
  fwrite(__ptr,__size,1,(FILE *)fp);
  return;
}

Assistant:

static void WriteOneParameter(FILE *fp, const char *text,
    double parameter, int size) {
  fwrite(text, 1, 4, fp);
  if (size == 4) {
    int parameter_int = static_cast<int>(parameter);
    fwrite(&parameter_int, 4, 1, fp);
  } else {
    fwrite(&parameter, 8, 1, fp);
  }
}